

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

Options * MemPoolOptionsForTest(NodeContext *node)

{
  long lVar1;
  pointer pVVar2;
  Options *in_RDI;
  long in_FS_OFFSET;
  Options *mempool_opts;
  Result<void> result;
  MemPoolOptions *in_stack_000001d0;
  CChainParams *in_stack_000001d8;
  ArgsManager *in_stack_000001e0;
  Result<void> *in_stack_ffffffffffffff48;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff50;
  optional<unsigned_int> *in_stack_ffffffffffffff58;
  seconds *func;
  Options *pOVar3;
  int line;
  optional<unsigned_int> *file;
  Result<void> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->check_ratio = 1;
  in_RDI->max_size_bytes = 300000000;
  func = &in_RDI->expiry;
  pOVar3 = in_RDI;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<unsigned_int,void>
            ((duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffff48,(uint *)0xebffa6);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<3600l,1l>,void>
            (in_stack_ffffffffffffff50,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffff48);
  CFeeRate::CFeeRate<unsigned_int>((CFeeRate *)in_stack_ffffffffffffff48,0);
  CFeeRate::CFeeRate<unsigned_int>((CFeeRate *)in_stack_ffffffffffffff48,0);
  CFeeRate::CFeeRate<unsigned_int>((CFeeRate *)in_stack_ffffffffffffff48,0);
  file = &pOVar3->max_datacarrier_bytes;
  std::optional<unsigned_int>::optional<const_unsigned_int_&,_true>
            (in_stack_ffffffffffffff58,(uint *)in_stack_ffffffffffffff50);
  pOVar3->permit_bare_multisig = true;
  pOVar3->require_standard = true;
  pOVar3->full_rbf = true;
  pOVar3->persist_v1_dat = false;
  (pOVar3->limits).ancestor_count = 0x19;
  (pOVar3->limits).ancestor_size_vbytes = 0x18a88;
  (pOVar3->limits).descendant_count = 0x19;
  (pOVar3->limits).descendant_size_vbytes = 0x18a88;
  pVVar2 = std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::get
                     ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                      in_stack_ffffffffffffff48);
  pOVar3->signals = pVVar2;
  Params();
  line = (int)((ulong)pOVar3 >> 0x20);
  ApplyArgsManOptions(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  inline_assertion_check<true,util::Result<void>const&>
            (in_stack_ffffffffffffff88,(char *)file,line,(char *)func,(char *)in_RDI);
  util::Result<void>::~Result(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CTxMemPool::Options MemPoolOptionsForTest(const NodeContext& node)
{
    CTxMemPool::Options mempool_opts{
        // Default to always checking mempool regardless of
        // chainparams.DefaultConsistencyChecks for tests
        .check_ratio = 1,
        .signals = node.validation_signals.get(),
    };
    const auto result{ApplyArgsManOptions(*node.args, ::Params(), mempool_opts)};
    Assert(result);
    return mempool_opts;
}